

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minilua.c
# Opt level: O1

TValue * luaH_getnum(Table *t,int key)

{
  Node *pNVar1;
  double dVar2;
  
  if (key - 1U < (uint)t->sizearray) {
    return t->array + (int)(key - 1U);
  }
  dVar2 = (double)key;
  if (key == 0) {
    pNVar1 = t->node;
  }
  else {
    pNVar1 = t->node + (ulong)(uint)((int)((ulong)dVar2 >> 0x20) + SUB84(dVar2,0)) %
                       (~(-1L << (t->lsizenode & 0x3f)) | 1U);
  }
  do {
    if ((pNVar1->i_key).nk.tt == 3) {
      if ((*(double *)&pNVar1->i_key == dVar2) && (!NAN(*(double *)&pNVar1->i_key) && !NAN(dVar2)))
      {
        return &pNVar1->i_val;
      }
    }
    pNVar1 = *(Node **)((long)&pNVar1->i_key + 0x10);
    if (pNVar1 == (Node *)0x0) {
      return &luaO_nilobject_;
    }
  } while( true );
}

Assistant:

static const TValue*luaH_getnum(Table*t,int key){
if(cast(unsigned int,key)-1<cast(unsigned int,t->sizearray))
return&t->array[key-1];
else{
lua_Number nk=cast_num(key);
Node*n=hashnum(t,nk);
do{
if(ttisnumber(gkey(n))&&luai_numeq(nvalue(gkey(n)),nk))
return gval(n);
else n=gnext(n);
}while(n);
return(&luaO_nilobject_);
}
}